

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O0

void Gia_ManPrintChoiceStats(Gia_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  bool bVar3;
  uint local_24;
  uint local_20;
  int nChoices;
  int nEquivs;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  local_20 = 0;
  local_24 = 0;
  Gia_ManMarkFanoutDrivers(p);
  nChoices = 0;
  do {
    bVar3 = false;
    if (nChoices < p->nObjs) {
      _nEquivs = Gia_ManObj(p,nChoices);
      bVar3 = _nEquivs != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) {
      Abc_Print(1,"Choice stats: Equivs =%7d. Choices =%7d.\n",(ulong)local_20,(ulong)local_24);
      Gia_ManCleanMark0(p);
      return;
    }
    iVar1 = Gia_ObjIsAnd(_nEquivs);
    if ((iVar1 != 0) && (iVar1 = Gia_ObjSibl(p,nChoices), iVar1 != 0)) {
      local_20 = local_20 + 1;
      if ((*(ulong *)_nEquivs >> 0x1e & 1) != 0) {
        local_24 = local_24 + 1;
      }
      pGVar2 = Gia_ObjSiblObj(p,nChoices);
      if ((*(ulong *)pGVar2 >> 0x1e & 1) != 0) {
        __assert_fail("!Gia_ObjSiblObj(p, i)->fMark0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                      ,0x19c,"void Gia_ManPrintChoiceStats(Gia_Man_t *)");
      }
      pGVar2 = Gia_ObjSiblObj(p,nChoices);
      iVar1 = Gia_ObjIsAnd(pGVar2);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsAnd(Gia_ObjSiblObj(p, i))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                      ,0x19d,"void Gia_ManPrintChoiceStats(Gia_Man_t *)");
      }
    }
    nChoices = nChoices + 1;
  } while( true );
}

Assistant:

void Gia_ManPrintChoiceStats( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, nEquivs = 0, nChoices = 0;
    Gia_ManMarkFanoutDrivers( p );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( !Gia_ObjSibl(p, i) )
            continue;
        nEquivs++;
        if ( pObj->fMark0 )
            nChoices++;
        assert( !Gia_ObjSiblObj(p, i)->fMark0 );
        assert( Gia_ObjIsAnd(Gia_ObjSiblObj(p, i)) );
    }
    Abc_Print( 1, "Choice stats: Equivs =%7d. Choices =%7d.\n", nEquivs, nChoices );
    Gia_ManCleanMark0( p );
}